

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

wchar_t * fmt::v6::internal::
          parse_align<wchar_t,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
                    *handler)

{
  char cVar1;
  align_t align;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  bool bVar4;
  basic_string_view<wchar_t> s;
  
  pwVar3 = begin + 1;
  pwVar2 = pwVar3;
  if (pwVar3 == end) {
    pwVar2 = begin;
  }
  do {
    cVar1 = (char)*pwVar2;
    if (cVar1 < '>') {
      if (cVar1 == '<') {
        align = left;
LAB_00183df5:
        if ((long)pwVar2 - (long)begin != 0) {
          if (*begin == L'{') {
            error_handler::on_error((error_handler *)begin,"invalid fill character \'{\'");
          }
          s.size_ = (long)pwVar2 - (long)begin >> 2;
          s.data_ = begin;
          fill_t<wchar_t>::operator=
                    (&((handler->
                       super_specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                       ).super_specs_setter<wchar_t>.specs_)->fill,s);
          pwVar3 = pwVar2 + 1;
        }
        specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
        ::on_align(handler,align);
        return pwVar3;
      }
      if (cVar1 == '=') {
        align = numeric;
        goto LAB_00183df5;
      }
    }
    else {
      if (cVar1 == '>') {
        align = right;
        goto LAB_00183df5;
      }
      if (cVar1 == '^') {
        align = center;
        goto LAB_00183df5;
      }
    }
    bVar4 = pwVar2 == begin;
    pwVar2 = begin;
    if (bVar4) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char* parse_align(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  auto p = next_code_point(begin, end);
  if (p == end) p = begin;
  for (;;) {
    switch (static_cast<char>(*p)) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
#if FMT_NUMERIC_ALIGN
    case '=':
      align = align::numeric;
      break;
#endif
    case '^':
      align = align::center;
      break;
    }
    if (align != align::none) {
      if (p != begin) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        handler.on_fill(basic_string_view<Char>(begin, to_unsigned(p - begin)));
        begin = p + 1;
      } else
        ++begin;
      handler.on_align(align);
      break;
    } else if (p == begin) {
      break;
    }
    p = begin;
  }
  return begin;
}